

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall
polyscope::SlicePlane::setSceneObjectUniforms(SlicePlane *this,ShaderProgram *p,bool alwaysPass)

{
  string *__rhs;
  bool bVar1;
  int iVar2;
  undefined1 extraout_var [56];
  undefined1 auVar3 [64];
  vec3 vVar5;
  col_type cVar6;
  col_type cVar7;
  mat4 viewMat;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  row_type local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  mat<4,_4,_float,_(glm::qualifier)0> local_70;
  undefined1 auVar4 [56];
  
  __rhs = &this->postfix;
  std::operator+(&local_90,"u_slicePlaneNormal_",__rhs);
  iVar2 = (*p->_vptr_ShaderProgram[2])(p,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if ((char)iVar2 != '\0') {
    if (alwaysPass) {
      cVar7.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
      cVar7.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
      cVar7.field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
           (int)SUB648(ZEXT464(0x7f800000),0);
      cVar7.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)(SUB648(ZEXT464(0x7f800000),0) >> 0x20);
      cVar6.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
      cVar6.field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
      cVar6.field_0 =
           (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
           (int)SUB648(ZEXT464(0xbf800000),0);
      cVar6.field_1 =
           (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
           (int)(SUB648(ZEXT464(0xbf800000),0) >> 0x20);
    }
    else {
      auVar4 = extraout_var;
      view::getCameraViewMatrix();
      vVar5 = getNormal(this);
      local_e0.field_2 =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)vVar5.field_2;
      auVar3._0_8_ = vVar5._0_8_;
      auVar3._8_56_ = auVar4;
      local_e0._0_8_ = vmovlps_avx(auVar3._0_16_);
      local_e0.field_3.w = 0.0;
      cVar6 = glm::operator*(&local_70,&local_e0);
      bVar1 = (this->active).value;
      local_e0.field_2.z = (uint)(bVar1 & 1) * (this->objectTransform).value.value[3].field_2;
      if (bVar1 == false) {
        cVar7 = SUB6416(ZEXT464(0x7f800000),0);
      }
      else {
        cVar7 = (this->objectTransform).value.value[3];
      }
      local_e0._0_8_ = vmovlps_avx((undefined1  [16])cVar7);
      local_e0.field_3.w = 1.0;
      cVar7 = glm::operator*(&local_70,&local_e0);
    }
    local_118 = cVar7._8_8_;
    local_128 = cVar7._0_8_;
    local_108 = cVar6._8_8_;
    local_f8 = cVar6._0_8_;
    std::operator+(&local_b0,"u_slicePlaneNormal_",__rhs);
    (*p->_vptr_ShaderProgram[9])(local_f8,local_108,p,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::operator+(&local_d0,"u_slicePlaneCenter_",__rhs);
    (*p->_vptr_ShaderProgram[9])(local_128,local_118,p,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return;
}

Assistant:

void SlicePlane::setSceneObjectUniforms(render::ShaderProgram& p, bool alwaysPass) {
  if (!p.hasUniform("u_slicePlaneNormal_" + postfix)) {
    return;
  }

  glm::vec3 normal, center;

  if (alwaysPass) {
    normal = glm::vec3{-1., 0., 0.};
    center = glm::vec3{std::numeric_limits<float>::infinity(), 0., 0.};
  } else {
    glm::mat4 viewMat = view::getCameraViewMatrix();
    normal = glm::vec3(viewMat * glm::vec4(getNormal(), 0.));
    center = glm::vec3(viewMat * glm::vec4(getCenter(), 1.));
  }

  p.setUniform("u_slicePlaneNormal_" + postfix, normal);
  p.setUniform("u_slicePlaneCenter_" + postfix, center);
}